

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O0

void __thiscall
TasgridWrapper::writeMatrix(TasgridWrapper *this,string *filename,int rows,int cols,double *mat)

{
  string *psVar1;
  _Setw _Var2;
  ulong uVar3;
  ostream *poVar4;
  double *pdVar5;
  undefined2 local_270;
  undefined1 local_26e;
  int local_26c;
  char tsg [3];
  size_t j;
  double *r;
  int i;
  undefined1 local_240 [8];
  Wrapper2D<const_double> matrix;
  ofstream ofs;
  size_t cols_t;
  double *mat_local;
  int cols_local;
  int rows_local;
  string *filename_local;
  TasgridWrapper *this_local;
  
  mat_local._0_4_ = cols;
  mat_local._4_4_ = rows;
  _cols_local = filename;
  filename_local = (string *)this;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    uVar3 = (ulong)(int)mat_local;
    std::ofstream::ofstream(&matrix.data);
    psVar1 = _cols_local;
    if ((this->useASCII & 1U) == 0) {
      std::operator|(_S_out,_S_bin);
      std::ofstream::open((string *)&matrix.data,(_Ios_Openmode)psVar1);
      local_26e = 0x47;
      local_270 = 0x5354;
      std::ostream::write((char *)&matrix.data,(long)&local_270);
      std::ostream::write((char *)&matrix.data,(long)&mat_local + 4);
      std::ostream::write((char *)&matrix.data,(long)&mat_local);
      TasGrid::Utils::size_mult<int,int>(mat_local._4_4_,(int)mat_local);
      std::ostream::write((char *)&matrix.data,(long)mat);
    }
    else {
      TasGrid::Utils::Wrapper2D<const_double>::Wrapper2D
                ((Wrapper2D<const_double> *)local_240,(int)mat_local,mat);
      std::ofstream::open((string *)&matrix.data,(_Ios_Openmode)_cols_local);
      poVar4 = (ostream *)std::ostream::operator<<(&matrix.data,mat_local._4_4_);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)mat_local);
      std::operator<<(poVar4,"\n");
      std::ios_base::precision((ios_base *)((long)&matrix.data + (long)matrix.data[-3]),0x11);
      std::ostream::operator<<(&matrix.data,std::scientific);
      for (r._0_4_ = 0; (int)r < mat_local._4_4_; r._0_4_ = (int)r + 1) {
        pdVar5 = TasGrid::Utils::Wrapper2D<const_double>::getStrip
                           ((Wrapper2D<const_double> *)local_240,(int)r);
        _Var2 = std::setw(0x19);
        poVar4 = std::operator<<((ostream *)&matrix.data,_Var2);
        std::ostream::operator<<(poVar4,*pdVar5);
        for (_tsg = 1; _tsg < uVar3; _tsg = _tsg + 1) {
          poVar4 = std::operator<<((ostream *)&matrix.data," ");
          local_26c = (int)std::setw(0x19);
          poVar4 = std::operator<<(poVar4,(_Setw)local_26c);
          std::ostream::operator<<(poVar4,pdVar5[_tsg]);
        }
        std::operator<<((ostream *)&matrix.data,"\n");
      }
      TasGrid::Utils::Wrapper2D<const_double>::~Wrapper2D((Wrapper2D<const_double> *)local_240);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&matrix.data);
  }
  return;
}

Assistant:

void TasgridWrapper::writeMatrix(std::string const &filename, int rows, int cols, const double mat[]) const{
    if (filename.empty()) return;
    size_t cols_t = (size_t) cols;
    std::ofstream ofs;
    if (useASCII){
        Utils::Wrapper2D<const double> matrix(cols, mat);
        ofs.open(filename);
        ofs << rows << " " << cols << "\n";
        ofs.precision(17);
        ofs << std::scientific;
        for(int i=0; i<rows; i++){
            double const * r = matrix.getStrip(i);
            ofs << setw(25) << r[0];
            for(size_t j=1; j<cols_t; j++){
                ofs << " " << setw(25) << r[j];
            }
            ofs << "\n";
        }
    }else{
        ofs.open(filename, std::ios::out | std::ios::binary);
        char tsg[3] = {'T', 'S', 'G'};
        ofs.write(tsg, 3*sizeof(char));
        ofs.write((char*) &rows, sizeof(int));
        ofs.write((char*) &cols, sizeof(int));
        ofs.write((char*) mat, Utils::size_mult(rows, cols) * sizeof(double));
    }
    ofs.close();
}